

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<float2,4ul,bas::RawAllocator>::Vector<4ul>
          (Vector<float2,4ul,bas::RawAllocator> *this,Vector<float2,_4UL,_bas::RawAllocator> *other)

{
  bool bVar1;
  size_t n;
  void *pvVar2;
  float2 *pfVar3;
  size_t capacity;
  size_t size;
  Vector<float2,_4UL,_bas::RawAllocator> *other_local;
  Vector<float2,_4UL,_bas::RawAllocator> *this_local;
  
  n = Vector<float2,_4UL,_bas::RawAllocator>::size(other);
  bVar1 = Vector<float2,_4UL,_bas::RawAllocator>::is_small(other);
  if (bVar1) {
    if (n < 5) {
      pfVar3 = Vector<float2,_4UL,_bas::RawAllocator>::small_buffer
                         ((Vector<float2,_4UL,_bas::RawAllocator> *)this);
      *(float2 **)this = pfVar3;
      *(size_t *)(this + 8) = *(long *)this + n * 8;
      *(long *)(this + 0x10) = *(long *)this + 0x20;
      uninitialized_relocate_n<float2>(other->m_begin,n,*(float2 **)this);
    }
    else {
      pvVar2 = RawAllocator::allocate((RawAllocator *)(this + 0x18),n << 3,4);
      *(void **)this = pvVar2;
      *(size_t *)(this + 8) = *(long *)this + n * 8;
      *(size_t *)(this + 0x10) = *(long *)this + n * 8;
      uninitialized_relocate_n<float2>(other->m_begin,n,*(float2 **)this);
    }
  }
  else {
    *(float2 **)this = other->m_begin;
    *(float2 **)(this + 8) = other->m_end;
    *(float2 **)(this + 0x10) = other->m_capacity_end;
  }
  pfVar3 = Vector<float2,_4UL,_bas::RawAllocator>::small_buffer(other);
  other->m_begin = pfVar3;
  other->m_end = other->m_begin;
  other->m_capacity_end = other->m_begin + 4;
  *(long *)(this + 0x40) = *(long *)(this + 8) - *(long *)this >> 3;
  other->m_debug_size = (long)other->m_end - (long)other->m_begin >> 3;
  return;
}

Assistant:

Vector(Vector<T, OtherN, Allocator> &&other) noexcept
        : m_allocator(other.m_allocator)
    {
        size_t size = other.size();

        if (other.is_small()) {
            if (size <= N) {
                /* Copy between inline buffers. */
                m_begin = this->small_buffer();
                m_end = m_begin + size;
                m_capacity_end = m_begin + N;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
            else {
                /* Copy from inline buffer to newly allocated buffer. */
                size_t capacity = size;
                m_begin = (T *)m_allocator.allocate(
                    sizeof(T) * capacity, std::alignment_of<T>::value);
                m_end = m_begin + size;
                m_capacity_end = m_begin + capacity;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
        }
        else {
            /* Steal the pointer. */
            m_begin = other.m_begin;
            m_end = other.m_end;
            m_capacity_end = other.m_capacity_end;
        }

        other.m_begin = other.small_buffer();
        other.m_end = other.m_begin;
        other.m_capacity_end = other.m_begin + OtherN;
        UPDATE_VECTOR_SIZE(this);
        UPDATE_VECTOR_SIZE(&other);
    }